

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse_new.cpp
# Opt level: O0

void __thiscall
base_iterator_matrix_sparse_element_test_comparison_Test::
~base_iterator_matrix_sparse_element_test_comparison_Test
          (base_iterator_matrix_sparse_element_test_comparison_Test *this)

{
  base_iterator_matrix_sparse_element_test_comparison_Test *this_local;
  
  ~base_iterator_matrix_sparse_element_test_comparison_Test(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

TEST_F(base_iterator_matrix_sparse_element_test, comparison) {
  Base_Iterator_Matrix_Sparse_Element<double, int, false> iter1(&columns[0], &entries[0]);
  Base_Iterator_Matrix_Sparse_Element<double, int, false> iter2(&columns[0], &entries[0]);
  Base_Iterator_Matrix_Sparse_Element<double, int, false> iter3(&columns[1], &entries[1]);

  EXPECT_EQ(iter1, iter2);
  EXPECT_NE(iter1, iter3);
}